

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O3

int __thiscall CPU::instrCMP0xc5(CPU *this)

{
  byte bVar1;
  uint16_t addr;
  Memory *this_00;
  byte bVar2;
  uint uVar3;
  
  bVar1 = this->A;
  this_00 = this->m;
  addr = this->PC;
  this->PC = addr + 1;
  bVar2 = Memory::Read8(this_00,addr);
  bVar2 = Memory::Read8(this_00,(ushort)bVar2);
  uVar3 = (uint)bVar1 - (uint)bVar2;
  this->field_0x2e =
       (bVar1 == bVar2) << 6 | this->field_0x2e & 0x3e | ((uVar3 & 0xff00) == 0) << 7 |
       (byte)uVar3 >> 7;
  return 3;
}

Assistant:

int CPU::instrCMP0xc5() {
	CMP(A, zeropage_addr());
	return 3;
}